

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall tf::Node::_release_all(Node *this,SmallVector<tf::Node_*,_2U> *nodes)

{
  Semaphores *pSVar1;
  undefined8 *puVar2;
  Semaphore **sem;
  undefined8 *puVar3;
  
  pSVar1 = (this->_semaphores)._M_t.
           super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
           _M_t.
           super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
           .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
  puVar2 = *(undefined8 **)&pSVar1->field_0x30;
  for (puVar3 = *(undefined8 **)&pSVar1->to_release; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    Semaphore::_release((Semaphore *)*puVar3,nodes);
  }
  return;
}

Assistant:

inline void Node::_release_all(SmallVector<Node*>& nodes) {
  // assert(_semaphores != nullptr);
  auto& to_release = _semaphores->to_release;
  for(const auto& sem : to_release) {
    sem->_release(nodes);
  }
}